

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FragmentInterpolationOffsetBitsCase::iterate
          (FragmentInterpolationOffsetBitsCase *this)

{
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ResultCollector result;
  string local_a0;
  CallLogWrapper local_80;
  ResultCollector local_68;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_80,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_68,log,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80.m_enableLog = true;
  gls::StateQueryUtil::verifyStateIntegerMin(&local_68,&local_80,0x8e5d,4,this->m_verifier);
  tcu::ResultCollector::setTestContextResult
            (&local_68,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
    operator_delete(local_68.m_message._M_dataplus._M_p,
                    local_68.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_prefix._M_dataplus._M_p != &local_68.m_prefix.field_2) {
    operator_delete(local_68.m_prefix._M_dataplus._M_p,
                    local_68.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_80);
  return STOP;
}

Assistant:

FragmentInterpolationOffsetBitsCase::IterateResult FragmentInterpolationOffsetBitsCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	verifyStateIntegerMin(result, gl, GL_FRAGMENT_INTERPOLATION_OFFSET_BITS, 4, m_verifier);

	result.setTestContextResult(m_testCtx);
	return STOP;
}